

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

void __thiscall CFG::cleanUp(CFG *this)

{
  eliminateEpsilonProductions(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Eliminated epsilon productions: ",0x20);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  printReadable(this);
  eliminateUnitProductions(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Eliminated unit productions: ",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  printReadable(this);
  eliminateUselessSymbols(this);
  return;
}

Assistant:

void CFG::cleanUp() {
    eliminateEpsilonProductions();

    std::cout << "Eliminated epsilon productions: " << std::endl;
    printReadable();

    eliminateUnitProductions();

    std::cout << "Eliminated unit productions: " << std::endl;
    printReadable();

    eliminateUselessSymbols();
}